

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.cpp
# Opt level: O0

int luaD_poscall(lua_State *L,StkId firstResult)

{
  short sVar1;
  CallInfo *pCVar2;
  StkId pTVar3;
  bool bVar4;
  TValue *io1;
  TValue *io2;
  ptrdiff_t fr;
  CallInfo *ci;
  int i;
  int wanted;
  StkId res;
  StkId firstResult_local;
  lua_State *L_local;
  
  pCVar2 = L->ci;
  res = firstResult;
  if ((L->hookmask & 6) != 0) {
    if ((L->hookmask & 2) != 0) {
      pTVar3 = L->stack;
      luaD_hook(L,1,-1);
      res = (StkId)((long)L->stack + ((long)firstResult - (long)pTVar3));
    }
    L->oldpc = (pCVar2->previous->u).l.savedpc;
  }
  _i = pCVar2->func;
  sVar1 = pCVar2->nresults;
  L->ci = pCVar2->previous;
  ci._0_4_ = (int)sVar1;
  while( true ) {
    bVar4 = false;
    if ((int)ci != 0) {
      bVar4 = res < L->top;
    }
    if (!bVar4) break;
    _i->value_ = res->value_;
    _i->tt_ = res->tt_;
    ci._0_4_ = (int)ci + -1;
    _i = _i + 1;
    res = res + 1;
  }
  while (0 < (int)ci) {
    _i->tt_ = 0;
    ci._0_4_ = (int)ci + -1;
    _i = _i + 1;
  }
  L->top = _i;
  return sVar1 + 1;
}

Assistant:

int luaD_poscall (lua_State *L, StkId firstResult) {
  StkId res;
  int wanted, i;
  CallInfo *ci = L->ci;
  if (L->hookmask & (LUA_MASKRET | LUA_MASKLINE)) {
    if (L->hookmask & LUA_MASKRET) {
      ptrdiff_t fr = savestack(L, firstResult);  /* hook may change stack */
      luaD_hook(L, LUA_HOOKRET, -1);
      firstResult = restorestack(L, fr);
    }
    L->oldpc = ci->previous->u.l.savedpc;  /* 'oldpc' for caller function */
  }
  res = ci->func;  /* res == final position of 1st result */
  wanted = ci->nresults;
  L->ci = ci = ci->previous;  /* back to caller */
  /* move results to correct place */
  for (i = wanted; i != 0 && firstResult < L->top; i--)
    setobjs2s(L, res++, firstResult++);
  while (i-- > 0)
    setnilvalue(res++);
  L->top = res;
  return (wanted - LUA_MULTRET);  /* 0 iff wanted == LUA_MULTRET */
}